

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>::templated_iterator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
::emplace<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>
          (sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
           *this,pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node> *key)

{
  EntryPointer current_entry;
  char distance_from_desired;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>::templated_iterator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_bool>
  pVar1;
  
  current_entry =
       (EntryPointer)
       (((ulong)((long)key->first * -0x61c8864680b583eb) >> ((byte)this[0x10] & 0x3f)) * 0x20 +
       *(long *)this);
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar1 = emplace_new_key<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>
                        (this,distance_from_desired,current_entry,key);
      return pVar1;
    }
    if (key->first == (current_entry->field_1).value.first) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar1._8_8_ = 0;
  pVar1.first.current = current_entry;
  return pVar1;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }